

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O0

R2Rect * __thiscall R2Rect::Intersection(R2Rect *__return_storage_ptr__,R2Rect *this,R2Rect *other)

{
  bool bVar1;
  R1Interval *pRVar2;
  R1Interval *pRVar3;
  undefined1 local_38 [8];
  R1Interval yy;
  R1Interval xx;
  R2Rect *other_local;
  R2Rect *this_local;
  
  pRVar2 = x(this);
  pRVar3 = x(other);
  join_0x00001240_0x00001200_ = R1Interval::Intersection(pRVar2,pRVar3);
  pRVar2 = y(this);
  pRVar3 = y(other);
  _local_38 = R1Interval::Intersection(pRVar2,pRVar3);
  bVar1 = R1Interval::is_empty((R1Interval *)(yy.bounds_.c_ + 1));
  if ((!bVar1) && (bVar1 = R1Interval::is_empty((R1Interval *)local_38), !bVar1)) {
    R2Rect(__return_storage_ptr__,(R1Interval *)(yy.bounds_.c_ + 1),(R1Interval *)local_38);
    return __return_storage_ptr__;
  }
  Empty();
  return __return_storage_ptr__;
}

Assistant:

R2Rect R2Rect::Intersection(const R2Rect& other) const {
  R1Interval xx = x().Intersection(other.x());
  R1Interval yy = y().Intersection(other.y());
  if (xx.is_empty() || yy.is_empty()) return Empty();
  return R2Rect(xx, yy);
}